

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::App(App *this,string *title)

{
  long lVar1;
  runtime_error *this_00;
  string *psVar2;
  string *psVar3;
  allocator<char> local_b9;
  string lcCType;
  string lang;
  string lcAll;
  string local_50;
  
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->injectedKeys);
  memset(&this->state,0,0xb0);
  this->colorMode = Palette;
  this->bgType = Theme;
  (this->colorTheme)._M_dataplus._M_p = (pointer)&(this->colorTheme).field_2;
  (this->colorTheme)._M_string_length = 0;
  (this->colorTheme).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->quitKey,"^D",(allocator<char> *)&lcAll);
  this->mouseEnabled = true;
  this->quit = false;
  this->initialized = false;
  (this->appTitle)._M_dataplus._M_p = (pointer)&(this->appTitle).field_2;
  (this->appTitle)._M_string_length = 0;
  (this->appTitle).field_2._M_local_buf[0] = '\0';
  if (instance == (App *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lcCType,"LC_ALL",(allocator<char> *)&lang);
    getEnvironmentVariable(&lcAll,&lcCType);
    std::__cxx11::string::~string((string *)&lcCType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lang,"LC_CTYPE",(allocator<char> *)&local_50);
    getEnvironmentVariable(&lcCType,&lang);
    std::__cxx11::string::~string((string *)&lang);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"LANG",&local_b9);
    getEnvironmentVariable(&lang,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    psVar2 = &lcCType;
    if (lcCType._M_string_length == 0) {
      psVar2 = &lang;
    }
    psVar3 = &lcAll;
    if (lcAll._M_string_length == 0) {
      psVar3 = psVar2;
    }
    lVar1 = std::__cxx11::string::find((char *)psVar3,0x19b198);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char *)psVar3,0x19b19e);
      std::__cxx11::string::~string((string *)&lang);
      std::__cxx11::string::~string((string *)&lcCType);
      std::__cxx11::string::~string((string *)&lcAll);
      if (lVar1 == -1) {
        std::operator<<((ostream *)&std::cout,
                        "\n\nThis application requires a UTF-8 compatible LANG environment variable to be set in the controlling terminal. Setting to C.UTF-8. Depending on your environment, you may see corrupted output. If that\'st he case, try to set LANG=C.UTF-8 before starting musikcube.\n\n\n\n"
                       );
        setenv("LANG","C.UTF-8",1);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&lang);
      std::__cxx11::string::~string((string *)&lcCType);
      std::__cxx11::string::~string((string *)&lcAll);
    }
    instance = this;
    this->minWidth = 0;
    this->minHeight = 0;
    this->mouseEnabled = true;
    this->quit = false;
    setlocale(6,"");
    signal(1,hangupHandler);
    signal(0x1c,resizedHandler);
    signal(0xd,(__sighandler_t)0x1);
    this->colorMode = Palette;
    InitCurses(this);
    SetTitle(this,title);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"app instance already running!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

App::App(const std::string& title) {
    if (instance) {
        throw std::runtime_error("app instance already running!");
    }

#ifndef WIN32
    if (!isLangUtf8()) {
        std::cout << "\n\nThis application requires a UTF-8 compatible LANG environment "
        "variable to be set in the controlling terminal. Setting to C.UTF-8. Depending on "
        "your environment, you may see corrupted output. If that'st he case, try to set "
        "LANG=C.UTF-8 before starting musikcube.\n\n\n\n";
        setenv("LANG", "C.UTF-8", 1);
    }
#endif

    instance = this; /* only one instance. */
    this->quit = false;
    this->minWidth = this->minHeight = 0;
    this->mouseEnabled = true;

#ifdef WIN32
    this->iconId = 0;
    this->colorMode = Colors::RGB;
    win32::ConfigureDpiAwareness();
#else
    setlocale(LC_ALL, "");
    std::signal(SIGHUP, hangupHandler);
    std::signal(SIGWINCH, resizedHandler);
    std::signal(SIGPIPE, SIG_IGN);
    this->colorMode = Colors::Palette;
#endif

    this->InitCurses();
    this->SetTitle(title);
}